

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.h
# Opt level: O1

void * absl::lts_20240722::flags_internal::FlagOps<int>(FlagOp op,void *v1,void *v2,void *v3)

{
  char cVar1;
  void *pvVar2;
  int *p;
  ulong uVar3;
  int temp;
  undefined4 local_30;
  undefined4 uStack_2c;
  long local_20 [2];
  
  switch(op) {
  case kAlloc:
    pvVar2 = operator_new(4);
    return pvVar2;
  case kDelete:
    uVar3 = 4;
    goto LAB_00103753;
  case kCopy:
  case kCopyConstruct:
    *(undefined4 *)v2 = *v1;
    break;
  case kSizeof:
    return (void *)0x4;
  case kFastTypeId:
    return "";
  case kRuntimeTypeId:
    return &int::typeinfo;
  case kParse:
    local_30 = *v2;
    cVar1 = absl::lts_20240722::flags_internal::AbslParseFlag(*v1,*(undefined8 *)((long)v1 + 8));
    if (cVar1 != '\0') {
      *(undefined4 *)v2 = local_30;
      return v2;
    }
    break;
  case kUnparse:
    absl::lts_20240722::flags_internal::Unparse_abi_cxx11_((int)(string *)&local_30);
    std::__cxx11::string::operator=((string *)v2,(string *)&local_30);
    v2 = (void *)CONCAT44(uStack_2c,local_30);
    if ((long *)v2 == local_20) {
      return (void *)0x0;
    }
    uVar3 = local_20[0] + 1;
LAB_00103753:
    operator_delete(v2,uVar3);
    break;
  case kValueOffset:
    return (void *)0x50;
  }
  return (void *)0x0;
}

Assistant:

void* FlagOps(FlagOp op, const void* v1, void* v2, void* v3) {
  struct AlignedSpace {
    alignas(MaskedPointer::RequiredAlignment()) alignas(T) char buf[sizeof(T)];
  };
  using Allocator = std::allocator<AlignedSpace>;
  switch (op) {
    case FlagOp::kAlloc: {
      Allocator alloc;
      return std::allocator_traits<Allocator>::allocate(alloc, 1);
    }
    case FlagOp::kDelete: {
      T* p = static_cast<T*>(v2);
      p->~T();
      Allocator alloc;
      std::allocator_traits<Allocator>::deallocate(
          alloc, reinterpret_cast<AlignedSpace*>(p), 1);
      return nullptr;
    }
    case FlagOp::kCopy:
      *static_cast<T*>(v2) = *static_cast<const T*>(v1);
      return nullptr;
    case FlagOp::kCopyConstruct:
      new (v2) T(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kSizeof:
      return reinterpret_cast<void*>(static_cast<uintptr_t>(sizeof(T)));
    case FlagOp::kFastTypeId:
      return const_cast<void*>(base_internal::FastTypeId<T>());
    case FlagOp::kRuntimeTypeId:
      return const_cast<std::type_info*>(GenRuntimeTypeId<T>());
    case FlagOp::kParse: {
      // Initialize the temporary instance of type T based on current value in
      // destination (which is going to be flag's default value).
      T temp(*static_cast<T*>(v2));
      if (!absl::ParseFlag<T>(*static_cast<const absl::string_view*>(v1), &temp,
                              static_cast<std::string*>(v3))) {
        return nullptr;
      }
      *static_cast<T*>(v2) = std::move(temp);
      return v2;
    }
    case FlagOp::kUnparse:
      *static_cast<std::string*>(v2) =
          absl::UnparseFlag<T>(*static_cast<const T*>(v1));
      return nullptr;
    case FlagOp::kValueOffset: {
      // Round sizeof(FlagImp) to a multiple of alignof(FlagValue<T>) to get the
      // offset of the data.
      size_t round_to = alignof(FlagValue<T>);
      size_t offset = (sizeof(FlagImpl) + round_to - 1) / round_to * round_to;
      return reinterpret_cast<void*>(offset);
    }
  }
  return nullptr;
}